

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::CoreMLModels::WordTagger::~WordTagger(WordTagger *this)

{
  ~WordTagger(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

WordTagger::~WordTagger() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.CoreMLModels.WordTagger)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}